

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec_utils.c
# Opt level: O0

int bgpsec_segment_to_str(char *buffer,rtr_signature_seg *sig_seg,rtr_secure_path_seg *sec_path)

{
  long lVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  rtr_secure_path_seg *sec_path_local;
  rtr_signature_seg *sig_seg_local;
  char *buffer_local;
  char byte_buffer [256];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  byte_buffer[0xe8] = '\0';
  byte_buffer[0xe9] = '\0';
  byte_buffer[0xea] = '\0';
  byte_buffer[0xeb] = '\0';
  byte_buffer[0xec] = '\0';
  byte_buffer[0xed] = '\0';
  byte_buffer[0xee] = '\0';
  byte_buffer[0xef] = '\0';
  byte_buffer[0xf0] = '\0';
  byte_buffer[0xf1] = '\0';
  byte_buffer[0xf2] = '\0';
  byte_buffer[0xf3] = '\0';
  byte_buffer[0xf4] = '\0';
  byte_buffer[0xf5] = '\0';
  byte_buffer[0xf6] = '\0';
  byte_buffer[0xf7] = '\0';
  byte_buffer[0xd8] = '\0';
  byte_buffer[0xd9] = '\0';
  byte_buffer[0xda] = '\0';
  byte_buffer[0xdb] = '\0';
  byte_buffer[0xdc] = '\0';
  byte_buffer[0xdd] = '\0';
  byte_buffer[0xde] = '\0';
  byte_buffer[0xdf] = '\0';
  byte_buffer[0xe0] = '\0';
  byte_buffer[0xe1] = '\0';
  byte_buffer[0xe2] = '\0';
  byte_buffer[0xe3] = '\0';
  byte_buffer[0xe4] = '\0';
  byte_buffer[0xe5] = '\0';
  byte_buffer[0xe6] = '\0';
  byte_buffer[0xe7] = '\0';
  byte_buffer[200] = '\0';
  byte_buffer[0xc9] = '\0';
  byte_buffer[0xca] = '\0';
  byte_buffer[0xcb] = '\0';
  byte_buffer[0xcc] = '\0';
  byte_buffer[0xcd] = '\0';
  byte_buffer[0xce] = '\0';
  byte_buffer[0xcf] = '\0';
  byte_buffer[0xd0] = '\0';
  byte_buffer[0xd1] = '\0';
  byte_buffer[0xd2] = '\0';
  byte_buffer[0xd3] = '\0';
  byte_buffer[0xd4] = '\0';
  byte_buffer[0xd5] = '\0';
  byte_buffer[0xd6] = '\0';
  byte_buffer[0xd7] = '\0';
  byte_buffer[0xb8] = '\0';
  byte_buffer[0xb9] = '\0';
  byte_buffer[0xba] = '\0';
  byte_buffer[0xbb] = '\0';
  byte_buffer[0xbc] = '\0';
  byte_buffer[0xbd] = '\0';
  byte_buffer[0xbe] = '\0';
  byte_buffer[0xbf] = '\0';
  byte_buffer[0xc0] = '\0';
  byte_buffer[0xc1] = '\0';
  byte_buffer[0xc2] = '\0';
  byte_buffer[0xc3] = '\0';
  byte_buffer[0xc4] = '\0';
  byte_buffer[0xc5] = '\0';
  byte_buffer[0xc6] = '\0';
  byte_buffer[199] = '\0';
  byte_buffer[0xa8] = '\0';
  byte_buffer[0xa9] = '\0';
  byte_buffer[0xaa] = '\0';
  byte_buffer[0xab] = '\0';
  byte_buffer[0xac] = '\0';
  byte_buffer[0xad] = '\0';
  byte_buffer[0xae] = '\0';
  byte_buffer[0xaf] = '\0';
  byte_buffer[0xb0] = '\0';
  byte_buffer[0xb1] = '\0';
  byte_buffer[0xb2] = '\0';
  byte_buffer[0xb3] = '\0';
  byte_buffer[0xb4] = '\0';
  byte_buffer[0xb5] = '\0';
  byte_buffer[0xb6] = '\0';
  byte_buffer[0xb7] = '\0';
  byte_buffer[0x98] = '\0';
  byte_buffer[0x99] = '\0';
  byte_buffer[0x9a] = '\0';
  byte_buffer[0x9b] = '\0';
  byte_buffer[0x9c] = '\0';
  byte_buffer[0x9d] = '\0';
  byte_buffer[0x9e] = '\0';
  byte_buffer[0x9f] = '\0';
  byte_buffer[0xa0] = '\0';
  byte_buffer[0xa1] = '\0';
  byte_buffer[0xa2] = '\0';
  byte_buffer[0xa3] = '\0';
  byte_buffer[0xa4] = '\0';
  byte_buffer[0xa5] = '\0';
  byte_buffer[0xa6] = '\0';
  byte_buffer[0xa7] = '\0';
  byte_buffer[0x88] = '\0';
  byte_buffer[0x89] = '\0';
  byte_buffer[0x8a] = '\0';
  byte_buffer[0x8b] = '\0';
  byte_buffer[0x8c] = '\0';
  byte_buffer[0x8d] = '\0';
  byte_buffer[0x8e] = '\0';
  byte_buffer[0x8f] = '\0';
  byte_buffer[0x90] = '\0';
  byte_buffer[0x91] = '\0';
  byte_buffer[0x92] = '\0';
  byte_buffer[0x93] = '\0';
  byte_buffer[0x94] = '\0';
  byte_buffer[0x95] = '\0';
  byte_buffer[0x96] = '\0';
  byte_buffer[0x97] = '\0';
  byte_buffer[0x78] = '\0';
  byte_buffer[0x79] = '\0';
  byte_buffer[0x7a] = '\0';
  byte_buffer[0x7b] = '\0';
  byte_buffer[0x7c] = '\0';
  byte_buffer[0x7d] = '\0';
  byte_buffer[0x7e] = '\0';
  byte_buffer[0x7f] = '\0';
  byte_buffer[0x80] = '\0';
  byte_buffer[0x81] = '\0';
  byte_buffer[0x82] = '\0';
  byte_buffer[0x83] = '\0';
  byte_buffer[0x84] = '\0';
  byte_buffer[0x85] = '\0';
  byte_buffer[0x86] = '\0';
  byte_buffer[0x87] = '\0';
  byte_buffer[0x68] = '\0';
  byte_buffer[0x69] = '\0';
  byte_buffer[0x6a] = '\0';
  byte_buffer[0x6b] = '\0';
  byte_buffer[0x6c] = '\0';
  byte_buffer[0x6d] = '\0';
  byte_buffer[0x6e] = '\0';
  byte_buffer[0x6f] = '\0';
  byte_buffer[0x70] = '\0';
  byte_buffer[0x71] = '\0';
  byte_buffer[0x72] = '\0';
  byte_buffer[0x73] = '\0';
  byte_buffer[0x74] = '\0';
  byte_buffer[0x75] = '\0';
  byte_buffer[0x76] = '\0';
  byte_buffer[0x77] = '\0';
  byte_buffer[0x58] = '\0';
  byte_buffer[0x59] = '\0';
  byte_buffer[0x5a] = '\0';
  byte_buffer[0x5b] = '\0';
  byte_buffer[0x5c] = '\0';
  byte_buffer[0x5d] = '\0';
  byte_buffer[0x5e] = '\0';
  byte_buffer[0x5f] = '\0';
  byte_buffer[0x60] = '\0';
  byte_buffer[0x61] = '\0';
  byte_buffer[0x62] = '\0';
  byte_buffer[99] = '\0';
  byte_buffer[100] = '\0';
  byte_buffer[0x65] = '\0';
  byte_buffer[0x66] = '\0';
  byte_buffer[0x67] = '\0';
  byte_buffer[0x48] = '\0';
  byte_buffer[0x49] = '\0';
  byte_buffer[0x4a] = '\0';
  byte_buffer[0x4b] = '\0';
  byte_buffer[0x4c] = '\0';
  byte_buffer[0x4d] = '\0';
  byte_buffer[0x4e] = '\0';
  byte_buffer[0x4f] = '\0';
  byte_buffer[0x50] = '\0';
  byte_buffer[0x51] = '\0';
  byte_buffer[0x52] = '\0';
  byte_buffer[0x53] = '\0';
  byte_buffer[0x54] = '\0';
  byte_buffer[0x55] = '\0';
  byte_buffer[0x56] = '\0';
  byte_buffer[0x57] = '\0';
  byte_buffer[0x38] = '\0';
  byte_buffer[0x39] = '\0';
  byte_buffer[0x3a] = '\0';
  byte_buffer[0x3b] = '\0';
  byte_buffer[0x3c] = '\0';
  byte_buffer[0x3d] = '\0';
  byte_buffer[0x3e] = '\0';
  byte_buffer[0x3f] = '\0';
  byte_buffer[0x40] = '\0';
  byte_buffer[0x41] = '\0';
  byte_buffer[0x42] = '\0';
  byte_buffer[0x43] = '\0';
  byte_buffer[0x44] = '\0';
  byte_buffer[0x45] = '\0';
  byte_buffer[0x46] = '\0';
  byte_buffer[0x47] = '\0';
  byte_buffer[0x28] = '\0';
  byte_buffer[0x29] = '\0';
  byte_buffer[0x2a] = '\0';
  byte_buffer[0x2b] = '\0';
  byte_buffer[0x2c] = '\0';
  byte_buffer[0x2d] = '\0';
  byte_buffer[0x2e] = '\0';
  byte_buffer[0x2f] = '\0';
  byte_buffer[0x30] = '\0';
  byte_buffer[0x31] = '\0';
  byte_buffer[0x32] = '\0';
  byte_buffer[0x33] = '\0';
  byte_buffer[0x34] = '\0';
  byte_buffer[0x35] = '\0';
  byte_buffer[0x36] = '\0';
  byte_buffer[0x37] = '\0';
  byte_buffer[0x18] = '\0';
  byte_buffer[0x19] = '\0';
  byte_buffer[0x1a] = '\0';
  byte_buffer[0x1b] = '\0';
  byte_buffer[0x1c] = '\0';
  byte_buffer[0x1d] = '\0';
  byte_buffer[0x1e] = '\0';
  byte_buffer[0x1f] = '\0';
  byte_buffer[0x20] = '\0';
  byte_buffer[0x21] = '\0';
  byte_buffer[0x22] = '\0';
  byte_buffer[0x23] = '\0';
  byte_buffer[0x24] = '\0';
  byte_buffer[0x25] = '\0';
  byte_buffer[0x26] = '\0';
  byte_buffer[0x27] = '\0';
  byte_buffer[8] = '\0';
  byte_buffer[9] = '\0';
  byte_buffer[10] = '\0';
  byte_buffer[0xb] = '\0';
  byte_buffer[0xc] = '\0';
  byte_buffer[0xd] = '\0';
  byte_buffer[0xe] = '\0';
  byte_buffer[0xf] = '\0';
  byte_buffer[0x10] = '\0';
  byte_buffer[0x11] = '\0';
  byte_buffer[0x12] = '\0';
  byte_buffer[0x13] = '\0';
  byte_buffer[0x14] = '\0';
  byte_buffer[0x15] = '\0';
  byte_buffer[0x16] = '\0';
  byte_buffer[0x17] = '\0';
  buffer_local = (char *)0x0;
  byte_buffer[0] = '\0';
  byte_buffer[1] = '\0';
  byte_buffer[2] = '\0';
  byte_buffer[3] = '\0';
  byte_buffer[4] = '\0';
  byte_buffer[5] = '\0';
  byte_buffer[6] = '\0';
  byte_buffer[7] = '\0';
  iVar2 = sprintf(buffer,"++++++++++++++++++++++++++++++++++++++++\n");
  pcVar4 = buffer + iVar2;
  iVar2 = sprintf(pcVar4,"Signature Segment:\n");
  pcVar4 = pcVar4 + iVar2;
  iVar2 = sprintf(pcVar4,"\tSKI:\n");
  pcVar4 = pcVar4 + iVar2;
  byte_sequence_to_str((char *)&buffer_local,sig_seg->ski,0x14,2);
  iVar2 = sprintf(pcVar4,"%s\n",&buffer_local);
  pcVar4 = pcVar4 + iVar2;
  iVar2 = sprintf(pcVar4,"\tLength: %d\n",(ulong)sig_seg->sig_len);
  pcVar4 = pcVar4 + iVar2;
  iVar2 = sprintf(pcVar4,"\tSignature:\n");
  pcVar4 = pcVar4 + iVar2;
  byte_buffer[0xe8] = '\0';
  byte_buffer[0xe9] = '\0';
  byte_buffer[0xea] = '\0';
  byte_buffer[0xeb] = '\0';
  byte_buffer[0xec] = '\0';
  byte_buffer[0xed] = '\0';
  byte_buffer[0xee] = '\0';
  byte_buffer[0xef] = '\0';
  byte_buffer[0xf0] = '\0';
  byte_buffer[0xf1] = '\0';
  byte_buffer[0xf2] = '\0';
  byte_buffer[0xf3] = '\0';
  byte_buffer[0xf4] = '\0';
  byte_buffer[0xf5] = '\0';
  byte_buffer[0xf6] = '\0';
  byte_buffer[0xf7] = '\0';
  byte_buffer[0xd8] = '\0';
  byte_buffer[0xd9] = '\0';
  byte_buffer[0xda] = '\0';
  byte_buffer[0xdb] = '\0';
  byte_buffer[0xdc] = '\0';
  byte_buffer[0xdd] = '\0';
  byte_buffer[0xde] = '\0';
  byte_buffer[0xdf] = '\0';
  byte_buffer[0xe0] = '\0';
  byte_buffer[0xe1] = '\0';
  byte_buffer[0xe2] = '\0';
  byte_buffer[0xe3] = '\0';
  byte_buffer[0xe4] = '\0';
  byte_buffer[0xe5] = '\0';
  byte_buffer[0xe6] = '\0';
  byte_buffer[0xe7] = '\0';
  byte_buffer[200] = '\0';
  byte_buffer[0xc9] = '\0';
  byte_buffer[0xca] = '\0';
  byte_buffer[0xcb] = '\0';
  byte_buffer[0xcc] = '\0';
  byte_buffer[0xcd] = '\0';
  byte_buffer[0xce] = '\0';
  byte_buffer[0xcf] = '\0';
  byte_buffer[0xd0] = '\0';
  byte_buffer[0xd1] = '\0';
  byte_buffer[0xd2] = '\0';
  byte_buffer[0xd3] = '\0';
  byte_buffer[0xd4] = '\0';
  byte_buffer[0xd5] = '\0';
  byte_buffer[0xd6] = '\0';
  byte_buffer[0xd7] = '\0';
  byte_buffer[0xb8] = '\0';
  byte_buffer[0xb9] = '\0';
  byte_buffer[0xba] = '\0';
  byte_buffer[0xbb] = '\0';
  byte_buffer[0xbc] = '\0';
  byte_buffer[0xbd] = '\0';
  byte_buffer[0xbe] = '\0';
  byte_buffer[0xbf] = '\0';
  byte_buffer[0xc0] = '\0';
  byte_buffer[0xc1] = '\0';
  byte_buffer[0xc2] = '\0';
  byte_buffer[0xc3] = '\0';
  byte_buffer[0xc4] = '\0';
  byte_buffer[0xc5] = '\0';
  byte_buffer[0xc6] = '\0';
  byte_buffer[199] = '\0';
  byte_buffer[0xa8] = '\0';
  byte_buffer[0xa9] = '\0';
  byte_buffer[0xaa] = '\0';
  byte_buffer[0xab] = '\0';
  byte_buffer[0xac] = '\0';
  byte_buffer[0xad] = '\0';
  byte_buffer[0xae] = '\0';
  byte_buffer[0xaf] = '\0';
  byte_buffer[0xb0] = '\0';
  byte_buffer[0xb1] = '\0';
  byte_buffer[0xb2] = '\0';
  byte_buffer[0xb3] = '\0';
  byte_buffer[0xb4] = '\0';
  byte_buffer[0xb5] = '\0';
  byte_buffer[0xb6] = '\0';
  byte_buffer[0xb7] = '\0';
  byte_buffer[0x98] = '\0';
  byte_buffer[0x99] = '\0';
  byte_buffer[0x9a] = '\0';
  byte_buffer[0x9b] = '\0';
  byte_buffer[0x9c] = '\0';
  byte_buffer[0x9d] = '\0';
  byte_buffer[0x9e] = '\0';
  byte_buffer[0x9f] = '\0';
  byte_buffer[0xa0] = '\0';
  byte_buffer[0xa1] = '\0';
  byte_buffer[0xa2] = '\0';
  byte_buffer[0xa3] = '\0';
  byte_buffer[0xa4] = '\0';
  byte_buffer[0xa5] = '\0';
  byte_buffer[0xa6] = '\0';
  byte_buffer[0xa7] = '\0';
  byte_buffer[0x88] = '\0';
  byte_buffer[0x89] = '\0';
  byte_buffer[0x8a] = '\0';
  byte_buffer[0x8b] = '\0';
  byte_buffer[0x8c] = '\0';
  byte_buffer[0x8d] = '\0';
  byte_buffer[0x8e] = '\0';
  byte_buffer[0x8f] = '\0';
  byte_buffer[0x90] = '\0';
  byte_buffer[0x91] = '\0';
  byte_buffer[0x92] = '\0';
  byte_buffer[0x93] = '\0';
  byte_buffer[0x94] = '\0';
  byte_buffer[0x95] = '\0';
  byte_buffer[0x96] = '\0';
  byte_buffer[0x97] = '\0';
  byte_buffer[0x78] = '\0';
  byte_buffer[0x79] = '\0';
  byte_buffer[0x7a] = '\0';
  byte_buffer[0x7b] = '\0';
  byte_buffer[0x7c] = '\0';
  byte_buffer[0x7d] = '\0';
  byte_buffer[0x7e] = '\0';
  byte_buffer[0x7f] = '\0';
  byte_buffer[0x80] = '\0';
  byte_buffer[0x81] = '\0';
  byte_buffer[0x82] = '\0';
  byte_buffer[0x83] = '\0';
  byte_buffer[0x84] = '\0';
  byte_buffer[0x85] = '\0';
  byte_buffer[0x86] = '\0';
  byte_buffer[0x87] = '\0';
  byte_buffer[0x68] = '\0';
  byte_buffer[0x69] = '\0';
  byte_buffer[0x6a] = '\0';
  byte_buffer[0x6b] = '\0';
  byte_buffer[0x6c] = '\0';
  byte_buffer[0x6d] = '\0';
  byte_buffer[0x6e] = '\0';
  byte_buffer[0x6f] = '\0';
  byte_buffer[0x70] = '\0';
  byte_buffer[0x71] = '\0';
  byte_buffer[0x72] = '\0';
  byte_buffer[0x73] = '\0';
  byte_buffer[0x74] = '\0';
  byte_buffer[0x75] = '\0';
  byte_buffer[0x76] = '\0';
  byte_buffer[0x77] = '\0';
  byte_buffer[0x58] = '\0';
  byte_buffer[0x59] = '\0';
  byte_buffer[0x5a] = '\0';
  byte_buffer[0x5b] = '\0';
  byte_buffer[0x5c] = '\0';
  byte_buffer[0x5d] = '\0';
  byte_buffer[0x5e] = '\0';
  byte_buffer[0x5f] = '\0';
  byte_buffer[0x60] = '\0';
  byte_buffer[0x61] = '\0';
  byte_buffer[0x62] = '\0';
  byte_buffer[99] = '\0';
  byte_buffer[100] = '\0';
  byte_buffer[0x65] = '\0';
  byte_buffer[0x66] = '\0';
  byte_buffer[0x67] = '\0';
  byte_buffer[0x48] = '\0';
  byte_buffer[0x49] = '\0';
  byte_buffer[0x4a] = '\0';
  byte_buffer[0x4b] = '\0';
  byte_buffer[0x4c] = '\0';
  byte_buffer[0x4d] = '\0';
  byte_buffer[0x4e] = '\0';
  byte_buffer[0x4f] = '\0';
  byte_buffer[0x50] = '\0';
  byte_buffer[0x51] = '\0';
  byte_buffer[0x52] = '\0';
  byte_buffer[0x53] = '\0';
  byte_buffer[0x54] = '\0';
  byte_buffer[0x55] = '\0';
  byte_buffer[0x56] = '\0';
  byte_buffer[0x57] = '\0';
  byte_buffer[0x38] = '\0';
  byte_buffer[0x39] = '\0';
  byte_buffer[0x3a] = '\0';
  byte_buffer[0x3b] = '\0';
  byte_buffer[0x3c] = '\0';
  byte_buffer[0x3d] = '\0';
  byte_buffer[0x3e] = '\0';
  byte_buffer[0x3f] = '\0';
  byte_buffer[0x40] = '\0';
  byte_buffer[0x41] = '\0';
  byte_buffer[0x42] = '\0';
  byte_buffer[0x43] = '\0';
  byte_buffer[0x44] = '\0';
  byte_buffer[0x45] = '\0';
  byte_buffer[0x46] = '\0';
  byte_buffer[0x47] = '\0';
  byte_buffer[0x28] = '\0';
  byte_buffer[0x29] = '\0';
  byte_buffer[0x2a] = '\0';
  byte_buffer[0x2b] = '\0';
  byte_buffer[0x2c] = '\0';
  byte_buffer[0x2d] = '\0';
  byte_buffer[0x2e] = '\0';
  byte_buffer[0x2f] = '\0';
  byte_buffer[0x30] = '\0';
  byte_buffer[0x31] = '\0';
  byte_buffer[0x32] = '\0';
  byte_buffer[0x33] = '\0';
  byte_buffer[0x34] = '\0';
  byte_buffer[0x35] = '\0';
  byte_buffer[0x36] = '\0';
  byte_buffer[0x37] = '\0';
  byte_buffer[0x18] = '\0';
  byte_buffer[0x19] = '\0';
  byte_buffer[0x1a] = '\0';
  byte_buffer[0x1b] = '\0';
  byte_buffer[0x1c] = '\0';
  byte_buffer[0x1d] = '\0';
  byte_buffer[0x1e] = '\0';
  byte_buffer[0x1f] = '\0';
  byte_buffer[0x20] = '\0';
  byte_buffer[0x21] = '\0';
  byte_buffer[0x22] = '\0';
  byte_buffer[0x23] = '\0';
  byte_buffer[0x24] = '\0';
  byte_buffer[0x25] = '\0';
  byte_buffer[0x26] = '\0';
  byte_buffer[0x27] = '\0';
  byte_buffer[8] = '\0';
  byte_buffer[9] = '\0';
  byte_buffer[10] = '\0';
  byte_buffer[0xb] = '\0';
  byte_buffer[0xc] = '\0';
  byte_buffer[0xd] = '\0';
  byte_buffer[0xe] = '\0';
  byte_buffer[0xf] = '\0';
  byte_buffer[0x10] = '\0';
  byte_buffer[0x11] = '\0';
  byte_buffer[0x12] = '\0';
  byte_buffer[0x13] = '\0';
  byte_buffer[0x14] = '\0';
  byte_buffer[0x15] = '\0';
  byte_buffer[0x16] = '\0';
  byte_buffer[0x17] = '\0';
  buffer_local = (char *)0x0;
  byte_buffer[0] = '\0';
  byte_buffer[1] = '\0';
  byte_buffer[2] = '\0';
  byte_buffer[3] = '\0';
  byte_buffer[4] = '\0';
  byte_buffer[5] = '\0';
  byte_buffer[6] = '\0';
  byte_buffer[7] = '\0';
  byte_sequence_to_str((char *)&buffer_local,sig_seg->signature,(uint)sig_seg->sig_len,2);
  iVar2 = sprintf(pcVar4,"%s\n",&buffer_local);
  pcVar4 = pcVar4 + iVar2;
  iVar2 = sprintf(pcVar4,"----------------------------------------\n");
  pcVar4 = pcVar4 + iVar2;
  iVar2 = sprintf(pcVar4,"Secure_Path Segment:\n\tpCount: %d\n\tFlags: %d\n\tAS number: %d\n",
                  (ulong)sec_path->pcount,(ulong)sec_path->flags,(ulong)sec_path->asn);
  pcVar4 = pcVar4 + iVar2;
  iVar2 = sprintf(pcVar4,"++++++++++++++++++++++++++++++++++++++++\n");
  iVar3 = sprintf(pcVar4 + iVar2,"\n");
  (pcVar4 + iVar2)[iVar3] = '\0';
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

int bgpsec_segment_to_str(char *buffer, struct rtr_signature_seg *sig_seg, struct rtr_secure_path_seg *sec_path)
{
	char byte_buffer[256] = {'\0'};

	buffer += sprintf(buffer, "++++++++++++++++++++++++++++++++++++++++\n");
	buffer += sprintf(buffer, "Signature Segment:\n");
	buffer += sprintf(buffer, "\tSKI:\n");

	byte_sequence_to_str(byte_buffer, sig_seg->ski, SKI_SIZE, 2);
	buffer += sprintf(buffer, "%s\n", byte_buffer);

	buffer += sprintf(buffer, "\tLength: %d\n", sig_seg->sig_len);
	buffer += sprintf(buffer, "\tSignature:\n");

	memset(byte_buffer, 0, sizeof(byte_buffer));
	byte_sequence_to_str(byte_buffer, sig_seg->signature, sig_seg->sig_len, 2);
	buffer += sprintf(buffer, "%s\n", byte_buffer);

	buffer += sprintf(buffer, "----------------------------------------\n");
	buffer += sprintf(buffer,
			  "Secure_Path Segment:\n"
			  "\tpCount: %d\n"
			  "\tFlags: %d\n"
			  "\tAS number: %d\n",
			  sec_path->pcount, sec_path->flags, sec_path->asn);
	buffer += sprintf(buffer, "++++++++++++++++++++++++++++++++++++++++\n");
	buffer += sprintf(buffer, "\n");
	*buffer = '\0';

	return RTR_BGPSEC_SUCCESS;
}